

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O3

void loadFunction(LoadState *S,Proto *f,TString *psource)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  lu_byte lVar25;
  byte bVar26;
  TString *pTVar27;
  size_t sVar28;
  size_t sVar29;
  Instruction *b;
  TValue *pTVar30;
  lu_byte *plVar31;
  Upvaldesc *pUVar32;
  Proto **ppPVar33;
  Proto *pPVar34;
  ls_byte *b_00;
  AbsLineInfo *pAVar35;
  LocVar *pLVar36;
  ulong uVar37;
  long lVar38;
  uint uVar39;
  ulong uVar40;
  int iVar52;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar54;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  long lVar53;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  int iVar77;
  undefined1 auVar75 [16];
  int iVar78;
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  int iVar92;
  int iVar96;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  lua_Number x;
  undefined8 local_50;
  undefined1 local_48 [16];
  long lVar58;
  
  pTVar27 = loadStringN(S,f);
  if (pTVar27 != (TString *)0x0) {
    psource = pTVar27;
  }
  f->source = psource;
  sVar28 = loadUnsigned(S,0x7fffffff);
  f->linedefined = (int)sVar28;
  sVar28 = loadUnsigned(S,0x7fffffff);
  f->lastlinedefined = (int)sVar28;
  lVar25 = loadByte(S);
  f->numparams = lVar25;
  lVar25 = loadByte(S);
  f->is_vararg = lVar25;
  lVar25 = loadByte(S);
  f->maxstacksize = lVar25;
  sVar29 = loadUnsigned(S,0x7fffffff);
  sVar28 = (long)(int)sVar29 * 4;
  b = (Instruction *)luaM_malloc_(S->L,sVar28,0);
  f->code = b;
  f->sizecode = (int)sVar29;
  loadBlock(S,b,sVar28);
  sVar28 = loadUnsigned(S,0x7fffffff);
  uVar39 = (uint)sVar28;
  pTVar30 = (TValue *)luaM_malloc_(S->L,(long)(int)uVar39 << 4,0);
  f->k = pTVar30;
  f->sizek = uVar39;
  auVar24 = _DAT_00164360;
  if (0 < (int)uVar39) {
    uVar37 = (ulong)(uVar39 & 0x7fffffff);
    uVar40 = (ulong)(uVar39 + 0xf & 0xfffffff0);
    lVar38 = uVar37 - 1;
    local_48._8_4_ = (int)lVar38;
    local_48._0_8_ = lVar38;
    local_48._12_4_ = (int)((ulong)lVar38 >> 0x20);
    plVar31 = &pTVar30[0xf].tt_;
    auVar41 = local_48;
    auVar55 = _DAT_0016baa0;
    auVar59 = _DAT_0016bab0;
    auVar60 = _DAT_0016bac0;
    auVar61 = _DAT_0016bad0;
    auVar62 = _DAT_0016bae0;
    auVar63 = _DAT_0016baf0;
    auVar64 = _DAT_0016bb00;
    auVar65 = _DAT_0016bb10;
    do {
      auVar75 = local_48 ^ auVar24;
      auVar79 = auVar65 ^ auVar24;
      iVar52 = auVar75._0_4_;
      iVar92 = -(uint)(iVar52 < auVar79._0_4_);
      iVar54 = auVar75._4_4_;
      auVar81._4_4_ = -(uint)(iVar54 < auVar79._4_4_);
      iVar77 = auVar75._8_4_;
      iVar96 = -(uint)(iVar77 < auVar79._8_4_);
      iVar78 = auVar75._12_4_;
      auVar81._12_4_ = -(uint)(iVar78 < auVar79._12_4_);
      auVar75._4_4_ = iVar92;
      auVar75._0_4_ = iVar92;
      auVar75._8_4_ = iVar96;
      auVar75._12_4_ = iVar96;
      auVar75 = pshuflw(auVar41,auVar75,0xe8);
      auVar80._4_4_ = -(uint)(auVar79._4_4_ == iVar54);
      auVar80._12_4_ = -(uint)(auVar79._12_4_ == iVar78);
      auVar80._0_4_ = auVar80._4_4_;
      auVar80._8_4_ = auVar80._12_4_;
      auVar66 = pshuflw(in_XMM11,auVar80,0xe8);
      auVar81._0_4_ = auVar81._4_4_;
      auVar81._8_4_ = auVar81._12_4_;
      auVar79 = pshuflw(auVar75,auVar81,0xe8);
      auVar41._8_4_ = 0xffffffff;
      auVar41._0_8_ = 0xffffffffffffffff;
      auVar41._12_4_ = 0xffffffff;
      auVar41 = (auVar79 | auVar66 & auVar75) ^ auVar41;
      auVar41 = packssdw(auVar41,auVar41);
      if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        plVar31[-0xf0] = 0;
      }
      auVar66._4_4_ = iVar92;
      auVar66._0_4_ = iVar92;
      auVar66._8_4_ = iVar96;
      auVar66._12_4_ = iVar96;
      auVar81 = auVar80 & auVar66 | auVar81;
      auVar41 = packssdw(auVar81,auVar81);
      auVar79._8_4_ = 0xffffffff;
      auVar79._0_8_ = 0xffffffffffffffff;
      auVar79._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 ^ auVar79,auVar41 ^ auVar79);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41._0_4_ >> 8 & 1) != 0) {
        plVar31[-0xe0] = 0;
      }
      auVar41 = auVar64 ^ auVar24;
      auVar67._0_4_ = -(uint)(iVar52 < auVar41._0_4_);
      auVar67._4_4_ = -(uint)(iVar54 < auVar41._4_4_);
      auVar67._8_4_ = -(uint)(iVar77 < auVar41._8_4_);
      auVar67._12_4_ = -(uint)(iVar78 < auVar41._12_4_);
      auVar82._4_4_ = auVar67._0_4_;
      auVar82._0_4_ = auVar67._0_4_;
      auVar82._8_4_ = auVar67._8_4_;
      auVar82._12_4_ = auVar67._8_4_;
      iVar92 = -(uint)(auVar41._4_4_ == iVar54);
      iVar96 = -(uint)(auVar41._12_4_ == iVar78);
      auVar11._4_4_ = iVar92;
      auVar11._0_4_ = iVar92;
      auVar11._8_4_ = iVar96;
      auVar11._12_4_ = iVar96;
      auVar93._4_4_ = auVar67._4_4_;
      auVar93._0_4_ = auVar67._4_4_;
      auVar93._8_4_ = auVar67._12_4_;
      auVar93._12_4_ = auVar67._12_4_;
      auVar41 = auVar11 & auVar82 | auVar93;
      auVar41 = packssdw(auVar41,auVar41);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 ^ auVar2,auVar41 ^ auVar2);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41._0_4_ >> 0x10 & 1) != 0) {
        plVar31[-0xd0] = 0;
      }
      auVar41 = pshufhw(auVar41,auVar82,0x84);
      auVar12._4_4_ = iVar92;
      auVar12._0_4_ = iVar92;
      auVar12._8_4_ = iVar96;
      auVar12._12_4_ = iVar96;
      auVar79 = pshufhw(auVar67,auVar12,0x84);
      auVar75 = pshufhw(auVar41,auVar93,0x84);
      auVar42._8_4_ = 0xffffffff;
      auVar42._0_8_ = 0xffffffffffffffff;
      auVar42._12_4_ = 0xffffffff;
      auVar42 = (auVar75 | auVar79 & auVar41) ^ auVar42;
      auVar41 = packssdw(auVar42,auVar42);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41._0_4_ >> 0x18 & 1) != 0) {
        plVar31[-0xc0] = 0;
      }
      auVar41 = auVar63 ^ auVar24;
      auVar68._0_4_ = -(uint)(iVar52 < auVar41._0_4_);
      auVar68._4_4_ = -(uint)(iVar54 < auVar41._4_4_);
      auVar68._8_4_ = -(uint)(iVar77 < auVar41._8_4_);
      auVar68._12_4_ = -(uint)(iVar78 < auVar41._12_4_);
      auVar13._4_4_ = auVar68._0_4_;
      auVar13._0_4_ = auVar68._0_4_;
      auVar13._8_4_ = auVar68._8_4_;
      auVar13._12_4_ = auVar68._8_4_;
      auVar79 = pshuflw(auVar93,auVar13,0xe8);
      auVar43._0_4_ = -(uint)(auVar41._0_4_ == iVar52);
      auVar43._4_4_ = -(uint)(auVar41._4_4_ == iVar54);
      auVar43._8_4_ = -(uint)(auVar41._8_4_ == iVar77);
      auVar43._12_4_ = -(uint)(auVar41._12_4_ == iVar78);
      auVar83._4_4_ = auVar43._4_4_;
      auVar83._0_4_ = auVar43._4_4_;
      auVar83._8_4_ = auVar43._12_4_;
      auVar83._12_4_ = auVar43._12_4_;
      auVar41 = pshuflw(auVar43,auVar83,0xe8);
      auVar84._4_4_ = auVar68._4_4_;
      auVar84._0_4_ = auVar68._4_4_;
      auVar84._8_4_ = auVar68._12_4_;
      auVar84._12_4_ = auVar68._12_4_;
      auVar75 = pshuflw(auVar68,auVar84,0xe8);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 & auVar79,(auVar75 | auVar41 & auVar79) ^ auVar3);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        plVar31[-0xb0] = 0;
      }
      auVar14._4_4_ = auVar68._0_4_;
      auVar14._0_4_ = auVar68._0_4_;
      auVar14._8_4_ = auVar68._8_4_;
      auVar14._12_4_ = auVar68._8_4_;
      auVar84 = auVar83 & auVar14 | auVar84;
      auVar75 = packssdw(auVar84,auVar84);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41,auVar75 ^ auVar4);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41._4_2_ >> 8 & 1) != 0) {
        plVar31[-0xa0] = 0;
      }
      auVar41 = auVar62 ^ auVar24;
      auVar69._0_4_ = -(uint)(iVar52 < auVar41._0_4_);
      auVar69._4_4_ = -(uint)(iVar54 < auVar41._4_4_);
      auVar69._8_4_ = -(uint)(iVar77 < auVar41._8_4_);
      auVar69._12_4_ = -(uint)(iVar78 < auVar41._12_4_);
      auVar85._4_4_ = auVar69._0_4_;
      auVar85._0_4_ = auVar69._0_4_;
      auVar85._8_4_ = auVar69._8_4_;
      auVar85._12_4_ = auVar69._8_4_;
      iVar92 = -(uint)(auVar41._4_4_ == iVar54);
      iVar96 = -(uint)(auVar41._12_4_ == iVar78);
      auVar15._4_4_ = iVar92;
      auVar15._0_4_ = iVar92;
      auVar15._8_4_ = iVar96;
      auVar15._12_4_ = iVar96;
      auVar94._4_4_ = auVar69._4_4_;
      auVar94._0_4_ = auVar69._4_4_;
      auVar94._8_4_ = auVar69._12_4_;
      auVar94._12_4_ = auVar69._12_4_;
      auVar41 = auVar15 & auVar85 | auVar94;
      auVar41 = packssdw(auVar41,auVar41);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 ^ auVar5,auVar41 ^ auVar5);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        plVar31[-0x90] = 0;
      }
      auVar41 = pshufhw(auVar41,auVar85,0x84);
      auVar16._4_4_ = iVar92;
      auVar16._0_4_ = iVar92;
      auVar16._8_4_ = iVar96;
      auVar16._12_4_ = iVar96;
      auVar79 = pshufhw(auVar69,auVar16,0x84);
      auVar75 = pshufhw(auVar41,auVar94,0x84);
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      auVar44 = (auVar75 | auVar79 & auVar41) ^ auVar44;
      auVar41 = packssdw(auVar44,auVar44);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41._6_2_ >> 8 & 1) != 0) {
        plVar31[-0x80] = 0;
      }
      auVar41 = auVar61 ^ auVar24;
      auVar70._0_4_ = -(uint)(iVar52 < auVar41._0_4_);
      auVar70._4_4_ = -(uint)(iVar54 < auVar41._4_4_);
      auVar70._8_4_ = -(uint)(iVar77 < auVar41._8_4_);
      auVar70._12_4_ = -(uint)(iVar78 < auVar41._12_4_);
      auVar17._4_4_ = auVar70._0_4_;
      auVar17._0_4_ = auVar70._0_4_;
      auVar17._8_4_ = auVar70._8_4_;
      auVar17._12_4_ = auVar70._8_4_;
      auVar79 = pshuflw(auVar94,auVar17,0xe8);
      auVar45._0_4_ = -(uint)(auVar41._0_4_ == iVar52);
      auVar45._4_4_ = -(uint)(auVar41._4_4_ == iVar54);
      auVar45._8_4_ = -(uint)(auVar41._8_4_ == iVar77);
      auVar45._12_4_ = -(uint)(auVar41._12_4_ == iVar78);
      auVar86._4_4_ = auVar45._4_4_;
      auVar86._0_4_ = auVar45._4_4_;
      auVar86._8_4_ = auVar45._12_4_;
      auVar86._12_4_ = auVar45._12_4_;
      auVar41 = pshuflw(auVar45,auVar86,0xe8);
      auVar87._4_4_ = auVar70._4_4_;
      auVar87._0_4_ = auVar70._4_4_;
      auVar87._8_4_ = auVar70._12_4_;
      auVar87._12_4_ = auVar70._12_4_;
      auVar75 = pshuflw(auVar70,auVar87,0xe8);
      auVar71._8_4_ = 0xffffffff;
      auVar71._0_8_ = 0xffffffffffffffff;
      auVar71._12_4_ = 0xffffffff;
      auVar71 = (auVar75 | auVar41 & auVar79) ^ auVar71;
      auVar75 = packssdw(auVar71,auVar71);
      auVar41 = packsswb(auVar41 & auVar79,auVar75);
      if ((auVar41 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        plVar31[-0x70] = 0;
      }
      auVar18._4_4_ = auVar70._0_4_;
      auVar18._0_4_ = auVar70._0_4_;
      auVar18._8_4_ = auVar70._8_4_;
      auVar18._12_4_ = auVar70._8_4_;
      auVar87 = auVar86 & auVar18 | auVar87;
      auVar75 = packssdw(auVar87,auVar87);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar75 = packssdw(auVar75 ^ auVar6,auVar75 ^ auVar6);
      auVar41 = packsswb(auVar41,auVar75);
      if ((auVar41._8_2_ >> 8 & 1) != 0) {
        plVar31[-0x60] = 0;
      }
      auVar41 = auVar60 ^ auVar24;
      auVar72._0_4_ = -(uint)(iVar52 < auVar41._0_4_);
      auVar72._4_4_ = -(uint)(iVar54 < auVar41._4_4_);
      auVar72._8_4_ = -(uint)(iVar77 < auVar41._8_4_);
      auVar72._12_4_ = -(uint)(iVar78 < auVar41._12_4_);
      auVar88._4_4_ = auVar72._0_4_;
      auVar88._0_4_ = auVar72._0_4_;
      auVar88._8_4_ = auVar72._8_4_;
      auVar88._12_4_ = auVar72._8_4_;
      iVar92 = -(uint)(auVar41._4_4_ == iVar54);
      iVar96 = -(uint)(auVar41._12_4_ == iVar78);
      auVar19._4_4_ = iVar92;
      auVar19._0_4_ = iVar92;
      auVar19._8_4_ = iVar96;
      auVar19._12_4_ = iVar96;
      auVar95._4_4_ = auVar72._4_4_;
      auVar95._0_4_ = auVar72._4_4_;
      auVar95._8_4_ = auVar72._12_4_;
      auVar95._12_4_ = auVar72._12_4_;
      auVar41 = auVar19 & auVar88 | auVar95;
      auVar41 = packssdw(auVar41,auVar41);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 ^ auVar7,auVar41 ^ auVar7);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        plVar31[-0x50] = 0;
      }
      auVar41 = pshufhw(auVar41,auVar88,0x84);
      auVar20._4_4_ = iVar92;
      auVar20._0_4_ = iVar92;
      auVar20._8_4_ = iVar96;
      auVar20._12_4_ = iVar96;
      auVar79 = pshufhw(auVar72,auVar20,0x84);
      auVar75 = pshufhw(auVar41,auVar95,0x84);
      auVar46._8_4_ = 0xffffffff;
      auVar46._0_8_ = 0xffffffffffffffff;
      auVar46._12_4_ = 0xffffffff;
      auVar46 = (auVar75 | auVar79 & auVar41) ^ auVar46;
      auVar41 = packssdw(auVar46,auVar46);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41._10_2_ >> 8 & 1) != 0) {
        plVar31[-0x40] = 0;
      }
      auVar41 = auVar59 ^ auVar24;
      auVar73._0_4_ = -(uint)(iVar52 < auVar41._0_4_);
      auVar73._4_4_ = -(uint)(iVar54 < auVar41._4_4_);
      auVar73._8_4_ = -(uint)(iVar77 < auVar41._8_4_);
      auVar73._12_4_ = -(uint)(iVar78 < auVar41._12_4_);
      auVar21._4_4_ = auVar73._0_4_;
      auVar21._0_4_ = auVar73._0_4_;
      auVar21._8_4_ = auVar73._8_4_;
      auVar21._12_4_ = auVar73._8_4_;
      auVar79 = pshuflw(auVar95,auVar21,0xe8);
      auVar47._0_4_ = -(uint)(auVar41._0_4_ == iVar52);
      auVar47._4_4_ = -(uint)(auVar41._4_4_ == iVar54);
      auVar47._8_4_ = -(uint)(auVar41._8_4_ == iVar77);
      auVar47._12_4_ = -(uint)(auVar41._12_4_ == iVar78);
      auVar89._4_4_ = auVar47._4_4_;
      auVar89._0_4_ = auVar47._4_4_;
      auVar89._8_4_ = auVar47._12_4_;
      auVar89._12_4_ = auVar47._12_4_;
      auVar41 = pshuflw(auVar47,auVar89,0xe8);
      auVar90._4_4_ = auVar73._4_4_;
      auVar90._0_4_ = auVar73._4_4_;
      auVar90._8_4_ = auVar73._12_4_;
      auVar90._12_4_ = auVar73._12_4_;
      auVar75 = pshuflw(auVar73,auVar90,0xe8);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 & auVar79,(auVar75 | auVar41 & auVar79) ^ auVar8);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        plVar31[-0x30] = 0;
      }
      auVar22._4_4_ = auVar73._0_4_;
      auVar22._0_4_ = auVar73._0_4_;
      auVar22._8_4_ = auVar73._8_4_;
      auVar22._12_4_ = auVar73._8_4_;
      auVar90 = auVar89 & auVar22 | auVar90;
      auVar75 = packssdw(auVar90,auVar90);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41,auVar75 ^ auVar9);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41._12_2_ >> 8 & 1) != 0) {
        plVar31[-0x20] = 0;
      }
      auVar41 = auVar55 ^ auVar24;
      auVar74._0_4_ = -(uint)(iVar52 < auVar41._0_4_);
      auVar74._4_4_ = -(uint)(iVar54 < auVar41._4_4_);
      auVar74._8_4_ = -(uint)(iVar77 < auVar41._8_4_);
      auVar74._12_4_ = -(uint)(iVar78 < auVar41._12_4_);
      auVar91._4_4_ = auVar74._0_4_;
      auVar91._0_4_ = auVar74._0_4_;
      auVar91._8_4_ = auVar74._8_4_;
      auVar91._12_4_ = auVar74._8_4_;
      iVar52 = -(uint)(auVar41._4_4_ == iVar54);
      iVar54 = -(uint)(auVar41._12_4_ == iVar78);
      auVar76._4_4_ = iVar52;
      auVar76._0_4_ = iVar52;
      auVar76._8_4_ = iVar54;
      auVar76._12_4_ = iVar54;
      auVar48._4_4_ = auVar74._4_4_;
      auVar48._0_4_ = auVar74._4_4_;
      auVar48._8_4_ = auVar74._12_4_;
      auVar48._12_4_ = auVar74._12_4_;
      auVar48 = auVar76 & auVar91 | auVar48;
      auVar41 = packssdw(auVar48,auVar48);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar41 = packssdw(auVar41 ^ auVar10,auVar41 ^ auVar10);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        plVar31[-0x10] = 0;
      }
      auVar41 = pshufhw(auVar41,auVar91,0x84);
      in_XMM11 = pshufhw(auVar74,auVar76,0x84);
      in_XMM11 = in_XMM11 & auVar41;
      auVar23._4_4_ = auVar74._4_4_;
      auVar23._0_4_ = auVar74._4_4_;
      auVar23._8_4_ = auVar74._12_4_;
      auVar23._12_4_ = auVar74._12_4_;
      auVar41 = pshufhw(auVar41,auVar23,0x84);
      auVar49._8_4_ = 0xffffffff;
      auVar49._0_8_ = 0xffffffffffffffff;
      auVar49._12_4_ = 0xffffffff;
      auVar49 = (auVar41 | in_XMM11) ^ auVar49;
      auVar41 = packssdw(auVar49,auVar49);
      auVar41 = packsswb(auVar41,auVar41);
      if ((auVar41._14_2_ >> 8 & 1) != 0) {
        *plVar31 = '\0';
      }
      lVar38 = (long)DAT_0016ca10;
      lVar58 = auVar65._8_8_;
      auVar65._0_8_ = auVar65._0_8_ + lVar38;
      lVar53 = DAT_0016ca10._8_8_;
      auVar65._8_8_ = lVar58 + lVar53;
      lVar58 = auVar64._8_8_;
      auVar64._0_8_ = auVar64._0_8_ + lVar38;
      auVar64._8_8_ = lVar58 + lVar53;
      lVar58 = auVar63._8_8_;
      auVar63._0_8_ = auVar63._0_8_ + lVar38;
      auVar63._8_8_ = lVar58 + lVar53;
      lVar58 = auVar62._8_8_;
      auVar62._0_8_ = auVar62._0_8_ + lVar38;
      auVar62._8_8_ = lVar58 + lVar53;
      lVar58 = auVar61._8_8_;
      auVar61._0_8_ = auVar61._0_8_ + lVar38;
      auVar61._8_8_ = lVar58 + lVar53;
      lVar58 = auVar60._8_8_;
      auVar60._0_8_ = auVar60._0_8_ + lVar38;
      auVar60._8_8_ = lVar58 + lVar53;
      lVar58 = auVar59._8_8_;
      auVar59._0_8_ = auVar59._0_8_ + lVar38;
      auVar59._8_8_ = lVar58 + lVar53;
      lVar58 = auVar55._8_8_;
      auVar55._0_8_ = auVar55._0_8_ + lVar38;
      auVar55._8_8_ = lVar58 + lVar53;
      plVar31 = plVar31 + 0x100;
      uVar40 = uVar40 - 0x10;
      auVar41 = _DAT_0016ca10;
    } while (uVar40 != 0);
    lVar38 = 0;
    do {
      pTVar30 = f->k;
      bVar26 = loadByte(S);
      if (bVar26 < 0x11) {
        if (bVar26 < 2) goto LAB_00153b49;
        if (bVar26 == 3) {
          loadBlock(S,&local_50,8);
          *(undefined8 *)((long)&pTVar30->value_ + lVar38) = local_50;
          bVar26 = 3;
          goto LAB_00153b49;
        }
        if (bVar26 == 4) goto LAB_00153b0d;
      }
      else {
        if (bVar26 != 0x11) {
          if (bVar26 == 0x14) {
LAB_00153b0d:
            pTVar27 = loadStringN(S,f);
            if (pTVar27 == (TString *)0x0) {
              error(S,"bad format for constant string");
            }
            *(TString **)((long)&pTVar30->value_ + lVar38) = pTVar27;
            bVar26 = pTVar27->tt | 0x40;
          }
          else {
            if (bVar26 != 0x13) goto LAB_00153b4e;
            loadBlock(S,&local_50,8);
            *(undefined8 *)((long)&pTVar30->value_ + lVar38) = local_50;
            bVar26 = 0x13;
          }
        }
LAB_00153b49:
        (&pTVar30->tt_)[lVar38] = bVar26;
      }
LAB_00153b4e:
      lVar38 = lVar38 + 0x10;
      uVar37 = uVar37 - 1;
    } while (uVar37 != 0);
  }
  sVar28 = loadUnsigned(S,0x7fffffff);
  uVar39 = (uint)sVar28;
  pUVar32 = (Upvaldesc *)luaM_malloc_(S->L,(long)(int)uVar39 << 4,0);
  f->upvalues = pUVar32;
  f->sizeupvalues = uVar39;
  auVar24 = _DAT_00164360;
  if (0 < (int)uVar39) {
    uVar37 = (ulong)(uVar39 & 0x7fffffff);
    uVar40 = (ulong)(uVar39 + 1 & 0xfffffffe);
    lVar38 = uVar37 - 1;
    auVar50._8_4_ = (int)lVar38;
    auVar50._0_8_ = lVar38;
    auVar50._12_4_ = (int)((ulong)lVar38 >> 0x20);
    pUVar32 = pUVar32 + 1;
    auVar50 = auVar50 ^ _DAT_00164360;
    auVar56 = _DAT_0016bb10;
    do {
      bVar1 = auVar50._0_4_ < SUB164(auVar56 ^ auVar24,0);
      iVar52 = auVar50._4_4_;
      iVar54 = SUB164(auVar56 ^ auVar24,4);
      if ((bool)(~(iVar52 < iVar54 || iVar54 == iVar52 && bVar1) & 1)) {
        pUVar32[-1].name = (TString *)0x0;
      }
      if (iVar52 >= iVar54 && (iVar54 != iVar52 || !bVar1)) {
        pUVar32->name = (TString *)0x0;
      }
      lVar38 = auVar56._8_8_;
      auVar56._0_8_ = auVar56._0_8_ + 2;
      auVar56._8_8_ = lVar38 + 2;
      pUVar32 = pUVar32 + 2;
      uVar40 = uVar40 - 2;
    } while (uVar40 != 0);
    lVar38 = 0;
    do {
      lVar25 = loadByte(S);
      (&f->upvalues->instack)[lVar38] = lVar25;
      lVar25 = loadByte(S);
      (&f->upvalues->idx)[lVar38] = lVar25;
      lVar25 = loadByte(S);
      (&f->upvalues->kind)[lVar38] = lVar25;
      lVar38 = lVar38 + 0x10;
      uVar37 = uVar37 - 1;
    } while (uVar37 != 0);
  }
  sVar28 = loadUnsigned(S,0x7fffffff);
  uVar39 = (uint)sVar28;
  ppPVar33 = (Proto **)luaM_malloc_(S->L,(long)(int)uVar39 * 8,0);
  f->p = ppPVar33;
  f->sizep = uVar39;
  if (0 < (int)uVar39) {
    uVar37 = 0;
    do {
      f->p[uVar37] = (Proto *)0x0;
      uVar37 = uVar37 + 1;
    } while ((uVar39 & 0x7fffffff) != uVar37);
    if (0 < (int)uVar39) {
      uVar37 = 0;
      do {
        pPVar34 = luaF_newproto(S->L);
        f->p[uVar37] = pPVar34;
        ppPVar33 = f->p;
        if (((f->marked & 0x20) != 0) && ((ppPVar33[uVar37]->marked & 0x18) != 0)) {
          luaC_barrier_(S->L,(GCObject *)f,(GCObject *)ppPVar33[uVar37]);
          ppPVar33 = f->p;
        }
        loadFunction(S,ppPVar33[uVar37],f->source);
        uVar37 = uVar37 + 1;
      } while ((uVar39 & 0x7fffffff) != uVar37);
    }
  }
  sVar28 = loadUnsigned(S,0x7fffffff);
  iVar52 = (int)sVar28;
  b_00 = (ls_byte *)luaM_malloc_(S->L,(long)iVar52,0);
  f->lineinfo = b_00;
  f->sizelineinfo = iVar52;
  loadBlock(S,b_00,(long)iVar52);
  sVar28 = loadUnsigned(S,0x7fffffff);
  uVar39 = (uint)sVar28;
  pAVar35 = (AbsLineInfo *)luaM_malloc_(S->L,(long)(int)uVar39 * 8,0);
  f->abslineinfo = pAVar35;
  f->sizeabslineinfo = uVar39;
  if (0 < (int)uVar39) {
    uVar37 = 0;
    do {
      sVar28 = loadUnsigned(S,0x7fffffff);
      f->abslineinfo[uVar37].pc = (int)sVar28;
      sVar28 = loadUnsigned(S,0x7fffffff);
      f->abslineinfo[uVar37].line = (int)sVar28;
      uVar37 = uVar37 + 1;
    } while ((uVar39 & 0x7fffffff) != uVar37);
  }
  sVar28 = loadUnsigned(S,0x7fffffff);
  uVar39 = (uint)sVar28;
  pLVar36 = (LocVar *)luaM_malloc_(S->L,(long)(int)uVar39 << 4,0);
  f->locvars = pLVar36;
  f->sizelocvars = uVar39;
  auVar24 = _DAT_00164360;
  if (0 < (int)uVar39) {
    uVar37 = (ulong)(uVar39 & 0x7fffffff);
    uVar40 = (ulong)(uVar39 + 1 & 0xfffffffe);
    lVar38 = uVar37 - 1;
    auVar51._8_4_ = (int)lVar38;
    auVar51._0_8_ = lVar38;
    auVar51._12_4_ = (int)((ulong)lVar38 >> 0x20);
    pLVar36 = pLVar36 + 1;
    auVar51 = auVar51 ^ _DAT_00164360;
    auVar57 = _DAT_0016bb10;
    do {
      auVar41 = auVar57 ^ auVar24;
      if ((bool)(~(auVar41._4_4_ == auVar51._4_4_ && auVar51._0_4_ < auVar41._0_4_ ||
                  auVar51._4_4_ < auVar41._4_4_) & 1)) {
        pLVar36[-1].varname = (TString *)0x0;
      }
      if ((auVar41._12_4_ != auVar51._12_4_ || auVar41._8_4_ <= auVar51._8_4_) &&
          auVar41._12_4_ <= auVar51._12_4_) {
        pLVar36->varname = (TString *)0x0;
      }
      lVar38 = auVar57._8_8_;
      auVar57._0_8_ = auVar57._0_8_ + 2;
      auVar57._8_8_ = lVar38 + 2;
      pLVar36 = pLVar36 + 2;
      uVar40 = uVar40 - 2;
    } while (uVar40 != 0);
    lVar38 = 0;
    do {
      pTVar27 = loadStringN(S,f);
      *(TString **)((long)&f->locvars->varname + lVar38) = pTVar27;
      sVar28 = loadUnsigned(S,0x7fffffff);
      *(int *)((long)&f->locvars->startpc + lVar38) = (int)sVar28;
      sVar28 = loadUnsigned(S,0x7fffffff);
      *(int *)((long)&f->locvars->endpc + lVar38) = (int)sVar28;
      lVar38 = lVar38 + 0x10;
      uVar37 = uVar37 - 1;
    } while (uVar37 != 0);
  }
  sVar28 = loadUnsigned(S,0x7fffffff);
  if (((int)sVar28 != 0) && (iVar52 = f->sizeupvalues, 0 < (long)iVar52)) {
    lVar38 = 0;
    do {
      pTVar27 = loadStringN(S,f);
      *(TString **)((long)&f->upvalues->name + lVar38) = pTVar27;
      lVar38 = lVar38 + 0x10;
    } while ((long)iVar52 * 0x10 != lVar38);
  }
  return;
}

Assistant:

static void loadFunction (LoadState *S, Proto *f, TString *psource) {
  f->source = loadStringN(S, f);
  if (f->source == NULL)  /* no source in dump? */
    f->source = psource;  /* reuse parent's source */
  f->linedefined = loadInt(S);
  f->lastlinedefined = loadInt(S);
  f->numparams = loadByte(S);
  f->is_vararg = loadByte(S);
  f->maxstacksize = loadByte(S);
  loadCode(S, f);
  loadConstants(S, f);
  loadUpvalues(S, f);
  loadProtos(S, f);
  loadDebug(S, f);
}